

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear_pack8.h
# Opt level: O0

void ncnn::resize_bilinear_image_pack8
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  long in_R9;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256 _Dp;
  __m256 _rows1_2;
  __m256 _rows0_1;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  __m256 _b1;
  __m256 _b0;
  __m256 _rows1_1;
  __m256 _rows0;
  __m256 _S11_1;
  __m256 _S10_1;
  __m256 _S01;
  __m256 _S00;
  __m256 _a1_1;
  __m256 _a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  __m256 _rows1;
  __m256 _S11;
  __m256 _S10;
  __m256 _a1;
  __m256 _a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff258;
  undefined8 **ppuVar20;
  int in_stack_fffffffffffff264;
  undefined4 in_stack_fffffffffffff268;
  undefined4 in_stack_fffffffffffff26c;
  int in_stack_fffffffffffff274;
  undefined4 in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff27c;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  int local_b1c;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  int local_9b0;
  int local_9ac;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  uint *local_998;
  long local_990;
  long local_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 *local_8c8;
  int local_8c0;
  int local_8bc;
  undefined8 *local_8b8;
  uint *local_8b0;
  long local_8a8;
  undefined8 *local_8a0;
  int local_894;
  int local_890;
  int local_88c;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_868;
  int *local_860;
  undefined8 local_858;
  undefined4 local_850;
  long *local_848;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined8 local_828;
  undefined8 *local_820;
  int *local_818;
  undefined8 local_810;
  undefined4 local_808;
  long *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  int local_7d8;
  int local_7d4;
  long local_7d0;
  uint *local_7c8;
  long local_7c0;
  uint *local_7b8;
  long *local_7b0;
  long *local_7a8;
  undefined8 **local_7a0;
  undefined8 **local_790;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  int local_73c;
  long *local_738;
  int local_72c;
  long *local_728;
  int local_71c;
  long *local_718;
  int local_70c;
  long *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 *local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 *local_620;
  uint local_618;
  uint local_614;
  uint local_610;
  uint local_60c;
  uint local_608;
  uint local_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  int local_370;
  undefined4 local_36c;
  undefined8 **local_368;
  int local_350;
  undefined4 local_34c;
  undefined8 **local_348;
  undefined8 *local_340;
  undefined8 *local_330;
  undefined1 local_320 [32];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [32];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined8 local_90;
  undefined4 local_84;
  undefined8 local_80;
  int local_74;
  undefined8 **local_70;
  undefined8 local_68;
  undefined4 local_5c;
  undefined8 local_58;
  int local_4c;
  undefined8 **local_48;
  undefined8 **local_40;
  undefined8 **local_38;
  
  local_7d4 = *(int *)((long)in_RSI + 0x2c);
  local_7d8 = (int)in_RSI[6];
  local_70 = &local_820;
  local_80 = 0x20;
  local_84 = 8;
  local_90 = 0;
  local_820 = (undefined8 *)0x0;
  local_818 = (int *)0x0;
  local_810 = 0;
  local_808 = 0;
  local_800 = (long *)0x0;
  local_7f8 = 0;
  local_7f4 = 0;
  local_7f0 = 0;
  local_7ec = 0;
  local_7e8 = 0;
  local_7e0 = 0;
  local_7d0 = in_R9;
  local_7c8 = in_R8;
  local_7c0 = in_RCX;
  local_7b8 = in_RDX;
  local_7b0 = in_RSI;
  local_7a8 = in_RDI;
  local_74 = local_7d4;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
              in_stack_fffffffffffff274,
              CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
              in_stack_fffffffffffff264,in_stack_fffffffffffff258);
  local_48 = &local_868;
  local_4c = local_7d4;
  local_58 = 0x20;
  local_5c = 8;
  local_68 = 0;
  local_868 = (undefined8 *)0x0;
  local_860 = (int *)0x0;
  local_858 = 0;
  local_850 = 0;
  local_848 = (long *)0x0;
  local_840 = 0;
  local_83c = 0;
  local_838 = 0;
  local_834 = 0;
  local_830 = 0;
  local_828 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
              in_stack_fffffffffffff274,
              CONCAT44(in_stack_fffffffffffff26c,in_stack_fffffffffffff268),
              in_stack_fffffffffffff264,in_stack_fffffffffffff258);
  local_38 = &local_820;
  local_880 = local_820;
  local_40 = &local_868;
  local_888 = local_868;
  local_88c = -2;
  for (local_890 = 0; puVar13 = local_880, local_890 < local_7d8; local_890 = local_890 + 1) {
    local_894 = *(int *)(local_7d0 + (long)local_890 * 4);
    if (local_894 != local_88c) {
      if (local_894 == local_88c + 1) {
        local_8a0 = local_880;
        local_880 = local_888;
        local_888 = puVar13;
        local_71c = local_894 + 1;
        local_718 = local_7a8;
        local_8a8 = *local_7a8 +
                    (long)*(int *)((long)local_7a8 + 0x2c) * (long)local_71c * local_7a8[2];
        local_8b0 = local_7b8;
        local_8b8 = puVar13;
        for (local_8bc = 0; local_8bc < local_7d4; local_8bc = local_8bc + 1) {
          local_8c0 = *(int *)(local_7c0 + (long)local_8bc * 4) << 3;
          local_8c8 = (undefined8 *)(local_8a8 + (long)local_8c0 * 4);
          local_604 = *local_8b0;
          auVar1 = vinsertps_avx(ZEXT416(local_604),ZEXT416(local_604),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_604),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_604),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_604),ZEXT416(local_604),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_604),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_604),0x30);
          auVar14._16_16_ = auVar1;
          auVar14._0_16_ = auVar2;
          local_320._0_8_ = auVar2._0_8_;
          local_320._8_8_ = auVar2._8_8_;
          local_320._16_8_ = auVar1._0_8_;
          local_320._24_8_ = auVar1._8_8_;
          local_900 = local_320._0_8_;
          uStack_8f8 = local_320._8_8_;
          uStack_8f0 = local_320._16_8_;
          uStack_8e8 = local_320._24_8_;
          local_608 = local_8b0[1];
          auVar3 = vinsertps_avx(ZEXT416(local_608),ZEXT416(local_608),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_608),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_608),0x30);
          auVar4 = vinsertps_avx(ZEXT416(local_608),ZEXT416(local_608),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_608),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_608),0x30);
          auVar15._16_16_ = auVar3;
          auVar15._0_16_ = auVar4;
          local_2e0._0_8_ = auVar4._0_8_;
          local_2e0._8_8_ = auVar4._8_8_;
          local_2e0._16_8_ = auVar3._0_8_;
          local_2e0._24_8_ = auVar3._8_8_;
          local_920 = local_2e0._0_8_;
          uStack_918 = local_2e0._8_8_;
          uStack_910 = local_2e0._16_8_;
          uStack_908 = local_2e0._24_8_;
          local_940 = *local_8c8;
          uStack_938 = local_8c8[1];
          uStack_930 = local_8c8[2];
          uStack_928 = local_8c8[3];
          local_750 = local_8c8 + 4;
          uVar5 = *local_750;
          uVar6 = local_8c8[5];
          uVar7 = local_8c8[6];
          uVar8 = local_8c8[7];
          local_520._0_4_ = (float)local_940;
          local_520._4_4_ = (float)((ulong)local_940 >> 0x20);
          uStack_518._0_4_ = (float)uStack_938;
          uStack_518._4_4_ = (float)((ulong)uStack_938 >> 0x20);
          uStack_510._0_4_ = (float)uStack_930;
          uStack_510._4_4_ = (float)((ulong)uStack_930 >> 0x20);
          uStack_508._0_4_ = (float)uStack_928;
          uStack_508._4_4_ = (float)((ulong)uStack_928 >> 0x20);
          local_540._0_4_ = auVar2._0_4_;
          local_540._4_4_ = auVar2._4_4_;
          uStack_538._0_4_ = auVar2._8_4_;
          uStack_538._4_4_ = auVar2._12_4_;
          uStack_530._0_4_ = auVar1._0_4_;
          uStack_530._4_4_ = auVar1._4_4_;
          uStack_528._0_4_ = auVar1._8_4_;
          local_980 = CONCAT44(local_520._4_4_ * local_540._4_4_,(float)local_520 * (float)local_540
                              );
          uStack_978 = CONCAT44(uStack_518._4_4_ * uStack_538._4_4_,
                                (float)uStack_518 * (float)uStack_538);
          uStack_970 = CONCAT44(uStack_510._4_4_ * uStack_530._4_4_,
                                (float)uStack_510 * (float)uStack_530);
          uStack_968 = CONCAT44(uStack_508._4_4_,(float)uStack_508 * (float)uStack_528);
          local_3c8 = &local_960;
          local_3d0 = &local_920;
          local_3d8 = &local_980;
          local_960._0_4_ = (float)uVar5;
          local_3a0 = (float)local_960;
          local_960._4_4_ = (float)((ulong)uVar5 >> 0x20);
          fStack_39c = local_960._4_4_;
          uStack_958._0_4_ = (float)uVar6;
          fStack_398 = (float)uStack_958;
          uStack_958._4_4_ = (float)((ulong)uVar6 >> 0x20);
          fStack_394 = uStack_958._4_4_;
          uStack_950._0_4_ = (float)uVar7;
          fStack_390 = (float)uStack_950;
          uStack_950._4_4_ = (float)((ulong)uVar7 >> 0x20);
          fStack_38c = uStack_950._4_4_;
          uStack_948._0_4_ = (float)uVar8;
          fStack_388 = (float)uStack_948;
          uStack_948._4_4_ = (float)((ulong)uVar8 >> 0x20);
          fStack_384 = uStack_948._4_4_;
          local_3c0._0_4_ = auVar4._0_4_;
          local_3c0._4_4_ = auVar4._4_4_;
          uStack_3b8._0_4_ = auVar4._8_4_;
          uStack_3b8._4_4_ = auVar4._12_4_;
          uStack_3b0._0_4_ = auVar3._0_4_;
          uStack_3b0._4_4_ = auVar3._4_4_;
          uStack_3a8._0_4_ = auVar3._8_4_;
          local_180 = (float)local_960 * (float)local_3c0;
          fStack_17c = local_960._4_4_ * local_3c0._4_4_;
          fStack_178 = (float)uStack_958 * (float)uStack_3b8;
          fStack_174 = uStack_958._4_4_ * uStack_3b8._4_4_;
          fStack_170 = (float)uStack_950 * (float)uStack_3b0;
          fStack_16c = uStack_950._4_4_ * uStack_3b0._4_4_;
          fStack_168 = (float)uStack_948 * (float)uStack_3a8;
          local_1a0 = local_980;
          uStack_198 = uStack_978;
          uStack_190 = uStack_970;
          uStack_188 = uStack_968;
          local_980 = CONCAT44(fStack_17c + local_520._4_4_ * local_540._4_4_,
                               local_180 + (float)local_520 * (float)local_540);
          uStack_978 = CONCAT44(fStack_174 + uStack_518._4_4_ * uStack_538._4_4_,
                                fStack_178 + (float)uStack_518 * (float)uStack_538);
          uStack_970 = CONCAT44(fStack_16c + uStack_510._4_4_ * uStack_530._4_4_,
                                fStack_170 + (float)uStack_510 * (float)uStack_530);
          uStack_968 = CONCAT44(uStack_948._4_4_ + uStack_508._4_4_,
                                fStack_168 + (float)uStack_508 * (float)uStack_528);
          local_620 = (undefined8 *)((long)puVar13 + (long)(local_8bc << 3) * 4);
          *local_620 = local_980;
          local_620[1] = uStack_978;
          local_620[2] = uStack_970;
          local_620[3] = uStack_968;
          local_8b0 = local_8b0 + 2;
          local_960 = uVar5;
          uStack_958 = uVar6;
          uStack_950 = uVar7;
          uStack_948 = uVar8;
          local_748 = local_8c8;
          local_640 = local_980;
          uStack_638 = uStack_978;
          uStack_630 = uStack_970;
          uStack_628 = uStack_968;
          local_540 = local_320._0_8_;
          uStack_538 = local_320._8_8_;
          uStack_530 = local_320._16_8_;
          uStack_528 = local_320._24_8_;
          local_520 = local_940;
          uStack_518 = uStack_938;
          uStack_510 = uStack_930;
          uStack_508 = uStack_928;
          local_3c0 = local_2e0._0_8_;
          uStack_3b8 = local_2e0._8_8_;
          uStack_3b0 = local_2e0._16_8_;
          uStack_3a8 = local_2e0._24_8_;
          local_320 = auVar14;
          local_300 = local_604;
          local_2fc = local_604;
          local_2f8 = local_604;
          local_2f4 = local_604;
          local_2f0 = local_604;
          local_2ec = local_604;
          local_2e8 = local_604;
          local_2e4 = local_604;
          local_2e0 = auVar15;
          local_2c0 = local_608;
          local_2bc = local_608;
          local_2b8 = local_608;
          local_2b4 = local_608;
          local_2b0 = local_608;
          local_2ac = local_608;
          local_2a8 = local_608;
          local_2a4 = local_608;
          fStack_164 = fStack_384;
        }
      }
      else {
        local_728 = local_7a8;
        local_988 = *local_7a8 +
                    (long)*(int *)((long)local_7a8 + 0x2c) * (long)local_894 * local_7a8[2];
        local_73c = local_894 + 1;
        local_738 = local_7a8;
        local_990 = *local_7a8 +
                    (long)*(int *)((long)local_7a8 + 0x2c) * (long)local_73c * local_7a8[2];
        local_998 = local_7b8;
        local_9a0 = local_880;
        local_9a8 = local_888;
        for (local_9ac = 0; local_72c = local_894, local_9ac < local_7d4; local_9ac = local_9ac + 1)
        {
          local_9b0 = *(int *)(local_7c0 + (long)local_9ac * 4) << 3;
          local_9b8 = (undefined8 *)(local_988 + (long)local_9b0 * 4);
          local_9c0 = (undefined8 *)(local_990 + (long)local_9b0 * 4);
          local_60c = *local_998;
          auVar1 = vinsertps_avx(ZEXT416(local_60c),ZEXT416(local_60c),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_60c),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_60c),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_60c),ZEXT416(local_60c),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_60c),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_60c),0x30);
          auVar16._16_16_ = auVar1;
          auVar16._0_16_ = auVar2;
          local_2a0._0_8_ = auVar2._0_8_;
          local_2a0._8_8_ = auVar2._8_8_;
          local_2a0._16_8_ = auVar1._0_8_;
          local_2a0._24_8_ = auVar1._8_8_;
          local_9e0 = local_2a0._0_8_;
          uStack_9d8 = local_2a0._8_8_;
          uStack_9d0 = local_2a0._16_8_;
          uStack_9c8 = local_2a0._24_8_;
          local_610 = local_998[1];
          auVar3 = vinsertps_avx(ZEXT416(local_610),ZEXT416(local_610),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_610),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_610),0x30);
          auVar4 = vinsertps_avx(ZEXT416(local_610),ZEXT416(local_610),0x10);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_610),0x20);
          auVar4 = vinsertps_avx(auVar4,ZEXT416(local_610),0x30);
          auVar17._16_16_ = auVar3;
          auVar17._0_16_ = auVar4;
          local_260._0_8_ = auVar4._0_8_;
          local_260._8_8_ = auVar4._8_8_;
          local_260._16_8_ = auVar3._0_8_;
          local_260._24_8_ = auVar3._8_8_;
          local_a00 = local_260._0_8_;
          uStack_9f8 = local_260._8_8_;
          uStack_9f0 = local_260._16_8_;
          uStack_9e8 = local_260._24_8_;
          local_a20 = *local_9b8;
          uStack_a18 = local_9b8[1];
          uStack_a10 = local_9b8[2];
          uStack_a08 = local_9b8[3];
          local_760 = local_9b8 + 4;
          uVar5 = *local_760;
          uVar6 = local_9b8[5];
          uVar7 = local_9b8[6];
          uVar8 = local_9b8[7];
          local_a60 = *local_9c0;
          uStack_a58 = local_9c0[1];
          uStack_a50 = local_9c0[2];
          uStack_a48 = local_9c0[3];
          local_770 = local_9c0 + 4;
          uVar9 = *local_770;
          uVar10 = local_9c0[5];
          uVar11 = local_9c0[6];
          uVar12 = local_9c0[7];
          local_560._0_4_ = (float)local_a20;
          local_560._4_4_ = (float)((ulong)local_a20 >> 0x20);
          uStack_558._0_4_ = (float)uStack_a18;
          uStack_558._4_4_ = (float)((ulong)uStack_a18 >> 0x20);
          uStack_550._0_4_ = (float)uStack_a10;
          uStack_550._4_4_ = (float)((ulong)uStack_a10 >> 0x20);
          uStack_548._0_4_ = (float)uStack_a08;
          uStack_548._4_4_ = (float)((ulong)uStack_a08 >> 0x20);
          local_580._0_4_ = auVar2._0_4_;
          local_580._4_4_ = auVar2._4_4_;
          uStack_578._0_4_ = auVar2._8_4_;
          uStack_578._4_4_ = auVar2._12_4_;
          uStack_570._0_4_ = auVar1._0_4_;
          uStack_570._4_4_ = auVar1._4_4_;
          uStack_568._0_4_ = auVar1._8_4_;
          local_aa0 = CONCAT44(local_560._4_4_ * local_580._4_4_,(float)local_560 * (float)local_580
                              );
          uStack_a98 = CONCAT44(uStack_558._4_4_ * uStack_578._4_4_,
                                (float)uStack_558 * (float)uStack_578);
          uStack_a90 = CONCAT44(uStack_550._4_4_ * uStack_570._4_4_,
                                (float)uStack_550 * (float)uStack_570);
          uStack_a88 = CONCAT44(uStack_548._4_4_,(float)uStack_548 * (float)uStack_568);
          local_5c0 = local_2a0._0_8_;
          uStack_5b8 = local_2a0._8_8_;
          uStack_5b0 = local_2a0._16_8_;
          uStack_5a8 = local_2a0._24_8_;
          local_5a0._0_4_ = (float)local_a60;
          local_5a0._4_4_ = (float)((ulong)local_a60 >> 0x20);
          uStack_598._0_4_ = (float)uStack_a58;
          uStack_598._4_4_ = (float)((ulong)uStack_a58 >> 0x20);
          uStack_590._0_4_ = (float)uStack_a50;
          uStack_590._4_4_ = (float)((ulong)uStack_a50 >> 0x20);
          uStack_588._0_4_ = (float)uStack_a48;
          uStack_588._4_4_ = (float)((ulong)uStack_a48 >> 0x20);
          local_ac0 = CONCAT44(local_5a0._4_4_ * local_580._4_4_,(float)local_5a0 * (float)local_580
                              );
          uStack_ab8 = CONCAT44(uStack_598._4_4_ * uStack_578._4_4_,
                                (float)uStack_598 * (float)uStack_578);
          uStack_ab0 = CONCAT44(uStack_590._4_4_ * uStack_570._4_4_,
                                (float)uStack_590 * (float)uStack_570);
          uStack_aa8 = CONCAT44(uStack_588._4_4_,(float)uStack_588 * (float)uStack_568);
          local_428 = &local_a40;
          local_430 = &local_a00;
          local_438 = &local_aa0;
          local_a40._0_4_ = (float)uVar5;
          local_400 = (float)local_a40;
          local_a40._4_4_ = (float)((ulong)uVar5 >> 0x20);
          fStack_3fc = local_a40._4_4_;
          uStack_a38._0_4_ = (float)uVar6;
          fStack_3f8 = (float)uStack_a38;
          uStack_a38._4_4_ = (float)((ulong)uVar6 >> 0x20);
          fStack_3f4 = uStack_a38._4_4_;
          uStack_a30._0_4_ = (float)uVar7;
          fStack_3f0 = (float)uStack_a30;
          uStack_a30._4_4_ = (float)((ulong)uVar7 >> 0x20);
          fStack_3ec = uStack_a30._4_4_;
          uStack_a28._0_4_ = (float)uVar8;
          fStack_3e8 = (float)uStack_a28;
          uStack_a28._4_4_ = (float)((ulong)uVar8 >> 0x20);
          fStack_3e4 = uStack_a28._4_4_;
          local_420._0_4_ = auVar4._0_4_;
          local_420._4_4_ = auVar4._4_4_;
          uStack_418._0_4_ = auVar4._8_4_;
          uStack_418._4_4_ = auVar4._12_4_;
          uStack_410._0_4_ = auVar3._0_4_;
          uStack_410._4_4_ = auVar3._4_4_;
          uStack_408._0_4_ = auVar3._8_4_;
          local_140 = (float)local_a40 * (float)local_420;
          fStack_13c = local_a40._4_4_ * local_420._4_4_;
          fStack_138 = (float)uStack_a38 * (float)uStack_418;
          fStack_134 = uStack_a38._4_4_ * uStack_418._4_4_;
          fStack_130 = (float)uStack_a30 * (float)uStack_410;
          fStack_12c = uStack_a30._4_4_ * uStack_410._4_4_;
          fStack_128 = (float)uStack_a28 * (float)uStack_408;
          local_160 = local_aa0;
          uStack_158 = uStack_a98;
          uStack_150 = uStack_a90;
          uStack_148 = uStack_a88;
          local_aa0 = CONCAT44(fStack_13c + local_560._4_4_ * local_580._4_4_,
                               local_140 + (float)local_560 * (float)local_580);
          uStack_a98 = CONCAT44(fStack_134 + uStack_558._4_4_ * uStack_578._4_4_,
                                fStack_138 + (float)uStack_558 * (float)uStack_578);
          uStack_a90 = CONCAT44(fStack_12c + uStack_550._4_4_ * uStack_570._4_4_,
                                fStack_130 + (float)uStack_550 * (float)uStack_570);
          uStack_a88 = CONCAT44(uStack_a28._4_4_ + uStack_548._4_4_,
                                fStack_128 + (float)uStack_548 * (float)uStack_568);
          local_488 = &local_a80;
          local_490 = &local_a00;
          local_498 = &local_ac0;
          local_a80._0_4_ = (float)uVar9;
          local_460 = (float)local_a80;
          local_a80._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_45c = local_a80._4_4_;
          uStack_a78._0_4_ = (float)uVar10;
          fStack_458 = (float)uStack_a78;
          uStack_a78._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_454 = uStack_a78._4_4_;
          uStack_a70._0_4_ = (float)uVar11;
          fStack_450 = (float)uStack_a70;
          uStack_a70._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_44c = uStack_a70._4_4_;
          uStack_a68._0_4_ = (float)uVar12;
          fStack_448 = (float)uStack_a68;
          uStack_a68._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_444 = uStack_a68._4_4_;
          local_480 = local_260._0_8_;
          uStack_478 = local_260._8_8_;
          uStack_470 = local_260._16_8_;
          uStack_468 = local_260._24_8_;
          local_100 = (float)local_a80 * (float)local_420;
          fStack_fc = local_a80._4_4_ * local_420._4_4_;
          fStack_f8 = (float)uStack_a78 * (float)uStack_418;
          fStack_f4 = uStack_a78._4_4_ * uStack_418._4_4_;
          fStack_f0 = (float)uStack_a70 * (float)uStack_410;
          fStack_ec = uStack_a70._4_4_ * uStack_410._4_4_;
          fStack_e8 = (float)uStack_a68 * (float)uStack_408;
          local_120 = local_ac0;
          uStack_118 = uStack_ab8;
          uStack_110 = uStack_ab0;
          uStack_108 = uStack_aa8;
          local_ac0 = CONCAT44(fStack_fc + local_5a0._4_4_ * local_580._4_4_,
                               local_100 + (float)local_5a0 * (float)local_580);
          uStack_ab8 = CONCAT44(fStack_f4 + uStack_598._4_4_ * uStack_578._4_4_,
                                fStack_f8 + (float)uStack_598 * (float)uStack_578);
          uStack_ab0 = CONCAT44(fStack_ec + uStack_590._4_4_ * uStack_570._4_4_,
                                fStack_f0 + (float)uStack_590 * (float)uStack_570);
          uStack_aa8 = CONCAT44(uStack_a68._4_4_ + uStack_588._4_4_,
                                fStack_e8 + (float)uStack_588 * (float)uStack_568);
          local_648 = (undefined8 *)((long)local_880 + (long)(local_9ac << 3) * 4);
          *local_648 = local_aa0;
          local_648[1] = uStack_a98;
          local_648[2] = uStack_a90;
          local_648[3] = uStack_a88;
          local_688 = (undefined8 *)((long)local_888 + (long)(local_9ac << 3) * 4);
          *local_688 = local_ac0;
          local_688[1] = uStack_ab8;
          local_688[2] = uStack_ab0;
          local_688[3] = uStack_aa8;
          local_998 = local_998 + 2;
          local_a80 = uVar9;
          uStack_a78 = uVar10;
          uStack_a70 = uVar11;
          uStack_a68 = uVar12;
          local_a40 = uVar5;
          uStack_a38 = uVar6;
          uStack_a30 = uVar7;
          uStack_a28 = uVar8;
          local_768 = local_9c0;
          local_758 = local_9b8;
          local_6c0 = local_ac0;
          uStack_6b8 = uStack_ab8;
          uStack_6b0 = uStack_ab0;
          uStack_6a8 = uStack_aa8;
          local_680 = local_aa0;
          uStack_678 = uStack_a98;
          uStack_670 = uStack_a90;
          uStack_668 = uStack_a88;
          local_5a0 = local_a60;
          uStack_598 = uStack_a58;
          uStack_590 = uStack_a50;
          uStack_588 = uStack_a48;
          local_580 = local_2a0._0_8_;
          uStack_578 = local_2a0._8_8_;
          uStack_570 = local_2a0._16_8_;
          uStack_568 = local_2a0._24_8_;
          local_560 = local_a20;
          uStack_558 = uStack_a18;
          uStack_550 = uStack_a10;
          uStack_548 = uStack_a08;
          local_420 = local_260._0_8_;
          uStack_418 = local_260._8_8_;
          uStack_410 = local_260._16_8_;
          uStack_408 = local_260._24_8_;
          local_2a0 = auVar16;
          local_280 = local_60c;
          local_27c = local_60c;
          local_278 = local_60c;
          local_274 = local_60c;
          local_270 = local_60c;
          local_26c = local_60c;
          local_268 = local_60c;
          local_264 = local_60c;
          local_260 = auVar17;
          local_240 = local_610;
          local_23c = local_610;
          local_238 = local_610;
          local_234 = local_610;
          local_230 = local_610;
          local_22c = local_610;
          local_228 = local_610;
          local_224 = local_610;
          fStack_124 = fStack_3e4;
          fStack_e4 = fStack_444;
        }
      }
    }
    local_614 = *local_7c8;
    auVar1 = vinsertps_avx(ZEXT416(local_614),ZEXT416(local_614),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_614),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_614),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_614),ZEXT416(local_614),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_614),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_614),0x30);
    auVar18._16_16_ = auVar1;
    auVar18._0_16_ = auVar2;
    local_220._0_8_ = auVar2._0_8_;
    local_220._8_8_ = auVar2._8_8_;
    local_220._16_8_ = auVar1._0_8_;
    local_220._24_8_ = auVar1._8_8_;
    local_ae0 = local_220._0_8_;
    uStack_ad8 = local_220._8_8_;
    uStack_ad0 = local_220._16_8_;
    uStack_ac8 = local_220._24_8_;
    local_618 = local_7c8[1];
    auVar3 = vinsertps_avx(ZEXT416(local_618),ZEXT416(local_618),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(local_618),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416(local_618),0x30);
    auVar4 = vinsertps_avx(ZEXT416(local_618),ZEXT416(local_618),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(local_618),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(local_618),0x30);
    auVar19._16_16_ = auVar3;
    auVar19._0_16_ = auVar4;
    local_1e0._0_8_ = auVar4._0_8_;
    local_1e0._8_8_ = auVar4._8_8_;
    local_1e0._16_8_ = auVar3._0_8_;
    local_1e0._24_8_ = auVar3._8_8_;
    local_b00 = local_1e0._0_8_;
    uStack_af8 = local_1e0._8_8_;
    uStack_af0 = local_1e0._16_8_;
    uStack_ae8 = local_1e0._24_8_;
    local_b08 = local_880;
    local_b10 = local_888;
    local_708 = local_7b0;
    local_70c = local_890;
    local_b18 = (undefined8 *)
                (*local_7b0 +
                (long)*(int *)((long)local_7b0 + 0x2c) * (long)local_890 * local_7b0[2]);
    for (local_b1c = 0; local_b1c < local_7d4; local_b1c = local_b1c + 1) {
      local_778 = local_b08;
      local_b40 = *local_b08;
      uStack_b38 = local_b08[1];
      uStack_b30 = local_b08[2];
      uStack_b28 = local_b08[3];
      local_780 = local_b10;
      uVar5 = *local_b10;
      uVar6 = local_b10[1];
      uVar7 = local_b10[2];
      uVar8 = local_b10[3];
      local_5e0._0_4_ = (float)local_b40;
      local_5e0._4_4_ = (float)((ulong)local_b40 >> 0x20);
      uStack_5d8._0_4_ = (float)uStack_b38;
      uStack_5d8._4_4_ = (float)((ulong)uStack_b38 >> 0x20);
      uStack_5d0._0_4_ = (float)uStack_b30;
      uStack_5d0._4_4_ = (float)((ulong)uStack_b30 >> 0x20);
      uStack_5c8._0_4_ = (float)uStack_b28;
      uStack_5c8._4_4_ = (float)((ulong)uStack_b28 >> 0x20);
      local_600._0_4_ = auVar2._0_4_;
      local_600._4_4_ = auVar2._4_4_;
      uStack_5f8._0_4_ = auVar2._8_4_;
      uStack_5f8._4_4_ = auVar2._12_4_;
      uStack_5f0._0_4_ = auVar1._0_4_;
      uStack_5f0._4_4_ = auVar1._4_4_;
      uStack_5e8._0_4_ = auVar1._8_4_;
      local_b80 = CONCAT44(local_5e0._4_4_ * local_600._4_4_,(float)local_5e0 * (float)local_600);
      uStack_b78 = CONCAT44(uStack_5d8._4_4_ * uStack_5f8._4_4_,
                            (float)uStack_5d8 * (float)uStack_5f8);
      uStack_b70 = CONCAT44(uStack_5d0._4_4_ * uStack_5f0._4_4_,
                            (float)uStack_5d0 * (float)uStack_5f0);
      uStack_b68 = CONCAT44(uStack_5c8._4_4_,(float)uStack_5c8 * (float)uStack_5e8);
      local_4e8 = &local_b60;
      local_4f0 = &local_b00;
      local_4f8 = &local_b80;
      local_b60._0_4_ = (float)uVar5;
      local_4c0 = (float)local_b60;
      local_b60._4_4_ = (float)((ulong)uVar5 >> 0x20);
      fStack_4bc = local_b60._4_4_;
      uStack_b58._0_4_ = (float)uVar6;
      fStack_4b8 = (float)uStack_b58;
      uStack_b58._4_4_ = (float)((ulong)uVar6 >> 0x20);
      fStack_4b4 = uStack_b58._4_4_;
      uStack_b50._0_4_ = (float)uVar7;
      fStack_4b0 = (float)uStack_b50;
      uStack_b50._4_4_ = (float)((ulong)uVar7 >> 0x20);
      fStack_4ac = uStack_b50._4_4_;
      uStack_b48._0_4_ = (float)uVar8;
      fStack_4a8 = (float)uStack_b48;
      uStack_b48._4_4_ = (float)((ulong)uVar8 >> 0x20);
      fStack_4a4 = uStack_b48._4_4_;
      local_4e0._0_4_ = auVar4._0_4_;
      local_4e0._4_4_ = auVar4._4_4_;
      uStack_4d8._0_4_ = auVar4._8_4_;
      uStack_4d8._4_4_ = auVar4._12_4_;
      uStack_4d0._0_4_ = auVar3._0_4_;
      uStack_4d0._4_4_ = auVar3._4_4_;
      uStack_4c8._0_4_ = auVar3._8_4_;
      local_c0 = (float)local_b60 * (float)local_4e0;
      fStack_bc = local_b60._4_4_ * local_4e0._4_4_;
      fStack_b8 = (float)uStack_b58 * (float)uStack_4d8;
      fStack_b4 = uStack_b58._4_4_ * uStack_4d8._4_4_;
      fStack_b0 = (float)uStack_b50 * (float)uStack_4d0;
      fStack_ac = uStack_b50._4_4_ * uStack_4d0._4_4_;
      fStack_a8 = (float)uStack_b48 * (float)uStack_4c8;
      local_e0 = local_b80;
      uStack_d8 = uStack_b78;
      uStack_d0 = uStack_b70;
      uStack_c8 = uStack_b68;
      local_b80 = CONCAT44(fStack_bc + local_5e0._4_4_ * local_600._4_4_,
                           local_c0 + (float)local_5e0 * (float)local_600);
      uStack_b78 = CONCAT44(fStack_b4 + uStack_5d8._4_4_ * uStack_5f8._4_4_,
                            fStack_b8 + (float)uStack_5d8 * (float)uStack_5f8);
      uStack_b70 = CONCAT44(fStack_ac + uStack_5d0._4_4_ * uStack_5f0._4_4_,
                            fStack_b0 + (float)uStack_5d0 * (float)uStack_5f0);
      uStack_b68 = CONCAT44(uStack_b48._4_4_ + uStack_5c8._4_4_,
                            fStack_a8 + (float)uStack_5c8 * (float)uStack_5e8);
      local_6c8 = local_b18;
      *local_b18 = local_b80;
      local_b18[1] = uStack_b78;
      local_b18[2] = uStack_b70;
      local_b18[3] = uStack_b68;
      local_b18 = local_b18 + 4;
      local_b08 = local_b08 + 4;
      local_b10 = local_b10 + 4;
      local_b60 = uVar5;
      uStack_b58 = uVar6;
      uStack_b50 = uVar7;
      uStack_b48 = uVar8;
      local_700 = local_b80;
      uStack_6f8 = uStack_b78;
      uStack_6f0 = uStack_b70;
      uStack_6e8 = uStack_b68;
      local_600 = local_220._0_8_;
      uStack_5f8 = local_220._8_8_;
      uStack_5f0 = local_220._16_8_;
      uStack_5e8 = local_220._24_8_;
      local_5e0 = local_b40;
      uStack_5d8 = uStack_b38;
      uStack_5d0 = uStack_b30;
      uStack_5c8 = uStack_b28;
      local_4e0 = local_1e0._0_8_;
      uStack_4d8 = local_1e0._8_8_;
      uStack_4d0 = local_1e0._16_8_;
      uStack_4c8 = local_1e0._24_8_;
      fStack_a4 = fStack_4a4;
    }
    local_7c8 = local_7c8 + 2;
    local_88c = local_894;
    local_220 = auVar18;
    local_200 = local_614;
    local_1fc = local_614;
    local_1f8 = local_614;
    local_1f4 = local_614;
    local_1f0 = local_614;
    local_1ec = local_614;
    local_1e8 = local_614;
    local_1e4 = local_614;
    local_1e0 = auVar19;
    local_1c0 = local_618;
    local_1bc = local_618;
    local_1b8 = local_618;
    local_1b4 = local_618;
    local_1b0 = local_618;
    local_1ac = local_618;
    local_1a8 = local_618;
    local_1a4 = local_618;
  }
  ppuVar20 = &local_868;
  local_7a0 = ppuVar20;
  local_348 = ppuVar20;
  if (local_860 != (int *)0x0) {
    local_34c = 0xffffffff;
    LOCK();
    local_350 = *local_860;
    *local_860 = *local_860 + -1;
    UNLOCK();
    if (local_350 == 1) {
      if (local_848 == (long *)0x0) {
        local_340 = local_868;
        if (local_868 != (undefined8 *)0x0) {
          free(local_868);
        }
      }
      else {
        (**(code **)(*local_848 + 0x18))(local_848,local_868);
      }
    }
  }
  *ppuVar20 = (undefined8 *)0x0;
  ppuVar20[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar20 + 3) = 0;
  *(undefined4 *)(ppuVar20 + 5) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x2c) = 0;
  *(undefined4 *)(ppuVar20 + 6) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x34) = 0;
  *(undefined4 *)(ppuVar20 + 7) = 0;
  ppuVar20[8] = (undefined8 *)0x0;
  ppuVar20[1] = (undefined8 *)0x0;
  local_790 = &local_820;
  if (local_818 != (int *)0x0) {
    local_36c = 0xffffffff;
    LOCK();
    local_370 = *local_818;
    *local_818 = *local_818 + -1;
    UNLOCK();
    if (local_370 == 1) {
      local_368 = local_790;
      if (local_800 == (long *)0x0) {
        local_330 = local_820;
        if (local_820 != (undefined8 *)0x0) {
          free(local_820);
        }
      }
      else {
        (**(code **)(*local_800 + 0x18))(local_800,local_820);
      }
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image_pack8(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)8 * 4u, 8);
    Mat rowsbuf1(w, (size_t)8 * 4u, 8);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S1p = S1 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);

                __m256 _S10 = _mm256_load_ps(S1p);
                __m256 _S11 = _mm256_load_ps(S1p + 8);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm256_store_ps(rows1p + dx * 8, _rows1);

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);

                __m256 _S00 = _mm256_load_ps(S0p);
                __m256 _S01 = _mm256_load_ps(S0p + 8);
                __m256 _S10 = _mm256_load_ps(S1p);
                __m256 _S11 = _mm256_load_ps(S1p + 8);
                __m256 _rows0 = _mm256_mul_ps(_S00, _a0);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                _rows0 = _mm256_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm256_store_ps(rows0p + dx * 8, _rows0);
                _mm256_store_ps(rows1p + dx * 8, _rows1);

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m256 _b0 = _mm256_set1_ps(beta[0]);
        __m256 _b1 = _mm256_set1_ps(beta[1]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m256 _rows0 = _mm256_load_ps(rows0p);
            __m256 _rows1 = _mm256_load_ps(rows1p);
            __m256 _Dp = _mm256_mul_ps(_rows0, _b0);
            _Dp = _mm256_comp_fmadd_ps(_rows1, _b1, _Dp);
            _mm256_store_ps(Dp, _Dp);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }

        beta += 2;
    }
}